

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseGenericImage
          (FfsParser *this,UByteArray *buffer,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  TreeModel *this_00;
  uint uVar1;
  uint uVar2;
  UINT32 UVar3;
  USTATUS UVar4;
  UByteArray local_e0;
  UByteArray local_c0;
  CBString local_a0;
  UModelIndex local_88;
  undefined1 local_60 [8];
  CBString info;
  CBString name;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *buffer_local;
  FfsParser *this_local;
  
  Bstrlib::CBString::CBString((CBString *)&info.super_tagbstring.data,"UEFI image");
  uVar1 = UByteArray::size(buffer);
  uVar2 = UByteArray::size(buffer);
  usprintf((CBString *)local_60,"Full size: %Xh (%u)",(ulong)uVar1,(ulong)uVar2);
  this_00 = this->model;
  Bstrlib::CBString::CBString(&local_a0);
  UByteArray::UByteArray(&local_c0);
  UByteArray::UByteArray(&local_e0);
  TreeModel::addItem(&local_88,this_00,localOffset,'>','[',(CBString *)&info.super_tagbstring.data,
                     &local_a0,(CBString *)local_60,&local_c0,buffer,&local_e0,Fixed,parent,'\0');
  index->m = local_88.m;
  index->r = local_88.r;
  index->c = local_88.c;
  index->i = local_88.i;
  UByteArray::~UByteArray(&local_e0);
  UByteArray::~UByteArray(&local_c0);
  Bstrlib::CBString::~CBString(&local_a0);
  UVar3 = TreeModel::base(this->model,parent);
  this->imageBase = UVar3 + localOffset;
  this->protectedRegionsBase = (ulong)this->imageBase;
  UVar4 = parseRawArea(this,index);
  Bstrlib::CBString::~CBString((CBString *)local_60);
  Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
  return UVar4;
}

Assistant:

USTATUS FfsParser::parseGenericImage(const UByteArray & buffer, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Parse as generic UEFI image
    UString name("UEFI image");
    UString info = usprintf("Full size: %Xh (%u)", (UINT32)buffer.size(), (UINT32)buffer.size());
    
    // Add tree item
    index = model->addItem(localOffset, Types::Image, Subtypes::UefiImage, name, UString(), info, UByteArray(), buffer, UByteArray(), Fixed, parent);
    
    // Parse the image as raw area
    imageBase = model->base(parent) + localOffset;
    protectedRegionsBase = imageBase;
    return parseRawArea(index);
}